

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::initFromNonbasic(HModel *this)

{
  HModel *in_RDI;
  HModel *unaff_retaddr;
  int in_stack_ffffffffffffffec;
  
  initBasicIndex(unaff_retaddr);
  allocate_WorkAndBaseArrays(in_RDI);
  populate_WorkArrays(in_RDI);
  mlFg_Update(in_RDI,in_stack_ffffffffffffffec);
  return;
}

Assistant:

void HModel::initFromNonbasic() {
  // Initialise basicIndex from nonbasic* then allocate and populate
  // (where possible) work* arrays and allocate basis* arrays
  initBasicIndex();
  allocate_WorkAndBaseArrays();
  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}